

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommandArgumentParserHelper.cxx
# Opt level: O0

int __thiscall
cmCommandArgumentParserHelper::ParseString(cmCommandArgumentParserHelper *this,string *str,int verb)

{
  int iVar1;
  ulong uVar2;
  size_type sVar3;
  char *yystr;
  YY_BUFFER_STATE b;
  ostream *poVar4;
  int res;
  yy_buffer_state *scanBuf;
  yyscan_t yyscanner;
  string *psStack_20;
  int verb_local;
  string *str_local;
  cmCommandArgumentParserHelper *this_local;
  
  yyscanner._4_4_ = verb;
  psStack_20 = str;
  str_local = (string *)this;
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    sVar3 = std::__cxx11::string::size();
    this->InputSize = sVar3;
    this->Verbose = yyscanner._4_4_;
    std::__cxx11::string::clear();
    cmCommandArgument_yylex_init(&scanBuf);
    yystr = (char *)std::__cxx11::string::c_str();
    b = cmCommandArgument_yy_scan_string(yystr,scanBuf);
    cmCommandArgument_yyset_extra((cmListFileLexer *)this,scanBuf);
    cmCommandArgument_SetupEscapes(scanBuf,(bool)(this->NoEscapeMode & 1));
    iVar1 = cmCommandArgument_yyparse(scanBuf);
    cmCommandArgument_yy_delete_buffer(b,scanBuf);
    cmCommandArgument_yylex_destroy(scanBuf);
    if (iVar1 == 0) {
      CleanupParser(this);
      if (this->Verbose != 0) {
        poVar4 = std::operator<<((ostream *)&std::cerr,"Expanding [");
        poVar4 = std::operator<<(poVar4,(string *)psStack_20);
        poVar4 = std::operator<<(poVar4,"] produced: [");
        poVar4 = std::operator<<(poVar4,(string *)&this->Result);
        poVar4 = std::operator<<(poVar4,"]");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      }
      this_local._4_4_ = 1;
    }
    else {
      this_local._4_4_ = 0;
    }
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int cmCommandArgumentParserHelper::ParseString(std::string const& str,
                                               int verb)
{
  if (str.empty()) {
    return 0;
  }
  this->InputSize = str.size();
  this->Verbose = verb;

  this->Result.clear();

  yyscan_t yyscanner;
  cmCommandArgument_yylex_init(&yyscanner);
  auto* scanBuf = cmCommandArgument_yy_scan_string(str.c_str(), yyscanner);
  cmCommandArgument_yyset_extra(this, yyscanner);
  cmCommandArgument_SetupEscapes(yyscanner, this->NoEscapeMode);
  int res = cmCommandArgument_yyparse(yyscanner);
  cmCommandArgument_yy_delete_buffer(scanBuf, yyscanner);
  cmCommandArgument_yylex_destroy(yyscanner);
  if (res != 0) {
    return 0;
  }

  this->CleanupParser();

  if (this->Verbose) {
    std::cerr << "Expanding [" << str << "] produced: [" << this->Result << "]"
              << std::endl;
  }
  return 1;
}